

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O3

string * __thiscall
iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
          (string *__return_storage_ptr__,IUStreamCapture *this)

{
  int iVar1;
  undefined1 auStack_1a8 [400];
  
  iVar1 = (*(this->m_tempfile).super_IFile.super_IOutStream._vptr_IOutStream[5])
                    (this,(this->m_tempfile).m_filename._M_dataplus._M_p,1);
  if ((char)iVar1 == '\0') {
    IUTestLog::IUTestLog
              ((IUTestLog *)auStack_1a8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
               ,0x45);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(auStack_1a8 + 0x18),"temp file open failed: ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(auStack_1a8 + 0x18),(this->m_tempfile).m_filename._M_dataplus._M_p,
               (this->m_tempfile).m_filename._M_string_length);
    IUTestLog::~IUTestLog((IUTestLog *)auStack_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    IInStream::ReadAll_abi_cxx11_
              (__return_storage_ptr__,&(this->m_tempfile).super_IFile.super_IInStream);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string GetStreamString()
    {
        if( !m_tempfile.Open(iutest::IFile::OpenRead) )
        {
            IUTEST_LOG_(WARNING) << "temp file open failed: " << m_tempfile.GetFileName();
            return "";
        }
        return m_tempfile.ReadAll();
    }